

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

symbolEncodingType_e
ZSTD_selectEncodingType
          (FSE_repeat *repeatMode,uint *count,uint max,size_t mostFrequent,size_t nbSeq,uint FSELog,
          FSE_CTable *prevCTable,short *defaultNorm,U32 defaultNormLog,
          ZSTD_defaultPolicy_e isDefaultAllowed,ZSTD_strategy strategy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  symbolEncodingType_e sVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  BYTE wksp [512];
  ulong local_2b0;
  short local_2a8 [56];
  undefined1 local_238 [520];
  
  if (mostFrequent == nbSeq) {
    *repeatMode = FSE_repeat_none;
    return (uint)(2 < nbSeq || isDefaultAllowed == ZSTD_defaultDisallowed);
  }
  if (strategy < ZSTD_lazy) {
    if (isDefaultAllowed == ZSTD_defaultDisallowed) goto LAB_00144344;
    if (1 < defaultNormLog - 5) {
      __assert_fail("defaultNormLog >= 5 && defaultNormLog <= 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4bd4,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if (strategy == 0) {
      __assert_fail("mult <= 9 && mult >= 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4bd5,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if ((999 < nbSeq) || (*repeatMode != FSE_repeat_valid)) {
      if ((((ulong)(10 - strategy) << ((byte)defaultNormLog & 0x3f)) >> 3 <= nbSeq) &&
         (nbSeq >> ((byte)defaultNormLog - 1 & 0x3f) <= mostFrequent)) goto LAB_0014432b;
      goto LAB_0014431f;
    }
    bVar3 = false;
    sVar4 = set_repeat;
  }
  else {
    local_2b0 = 0xffffffffffffffff;
    sVar11 = 0xffffffffffffffff;
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      sVar11 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,count,max);
    }
    if (*repeatMode != FSE_repeat_none) {
      local_2b0 = ZSTD_fseBitCost(prevCTable,count,max);
    }
    uVar5 = FSE_optimalTableLog_internal(FSELog,nbSeq,max,2);
    sVar6 = FSE_normalizeCount(local_2a8,uVar5,count,nbSeq,max,(uint)(0x7ff < nbSeq));
    if (sVar6 < 0xffffffffffffff89) {
      sVar6 = FSE_writeNCount(local_238,0x200,local_2a8,max,uVar5);
    }
    if (nbSeq == 0) {
      __assert_fail("total > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4b74,
                    "size_t ZSTD_entropyCost(const unsigned int *, const unsigned int, const size_t)"
                   );
    }
    uVar9 = 0;
    uVar5 = 0;
    do {
      uVar10 = count[uVar9];
      if (nbSeq <= uVar10) {
        __assert_fail("count[s] < total",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4b79,
                      "size_t ZSTD_entropyCost(const unsigned int *, const unsigned int, const size_t)"
                     );
      }
      uVar8 = CONCAT44(0,uVar10 << 8);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = nbSeq;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar8;
      mostFrequent = SUB168(auVar2 / auVar1,0);
      sVar7 = mostFrequent;
      if (uVar8 < nbSeq) {
        sVar7 = 1;
      }
      if (uVar10 == 0) {
        sVar7 = mostFrequent;
      }
      uVar5 = uVar5 + uVar10 * kInverseProbabilityLog256[sVar7];
      uVar10 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar10;
    } while (uVar10 <= max);
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      if (0xffffffffffffff88 < sVar11) {
        __assert_fail("!ZSTD_isError(basicCost)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4bef,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
      mostFrequent = CONCAT71(SUB167(auVar2 / auVar1,1),*repeatMode != FSE_repeat_valid);
      if (0xffffffffffffff88 < local_2b0 && *repeatMode == FSE_repeat_valid) {
        __assert_fail("!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4bf0,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
    }
    if (0xffffffffffffff88 < sVar6) {
      __assert_fail("!ZSTD_isError(NCountCost)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4bf2,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    uVar9 = sVar6 * 8 + (ulong)(uVar5 >> 8);
    if (0xffffffffffffff87 < uVar9) {
      __assert_fail("compressedCost < ERROR(maxCode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4bf3,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if ((local_2b0 < sVar11) || (uVar9 < sVar11)) {
      if (uVar9 < local_2b0) {
        if (sVar11 <= uVar9) {
          __assert_fail("compressedCost < basicCost && compressedCost < repeatCost",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4c01,
                        "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                       );
        }
LAB_0014432b:
        sVar4 = (symbolEncodingType_e)mostFrequent;
        bVar3 = true;
      }
      else {
        if (0xffffffffffffff88 < local_2b0) {
          __assert_fail("!ZSTD_isError(repeatCost)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4bfe,
                        "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                       );
        }
        sVar4 = set_repeat;
        bVar3 = false;
      }
    }
    else {
      if (isDefaultAllowed == ZSTD_defaultDisallowed) {
        __assert_fail("isDefaultAllowed",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4bf8,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
LAB_0014431f:
      *repeatMode = FSE_repeat_none;
      bVar3 = false;
      sVar4 = set_basic;
    }
  }
  if (!bVar3) {
    return sVar4;
  }
LAB_00144344:
  *repeatMode = FSE_repeat_check;
  return set_compressed;
}

Assistant:

symbolEncodingType_e
ZSTD_selectEncodingType(
        FSE_repeat* repeatMode, unsigned const* count, unsigned const max,
        size_t const mostFrequent, size_t nbSeq, unsigned const FSELog,
        FSE_CTable const* prevCTable,
        short const* defaultNorm, U32 defaultNormLog,
        ZSTD_defaultPolicy_e const isDefaultAllowed,
        ZSTD_strategy const strategy)
{
    ZSTD_STATIC_ASSERT(ZSTD_defaultDisallowed == 0 && ZSTD_defaultAllowed != 0);
    if (mostFrequent == nbSeq) {
        *repeatMode = FSE_repeat_none;
        if (isDefaultAllowed && nbSeq <= 2) {
            /* Prefer set_basic over set_rle when there are 2 or fewer symbols,
             * since RLE uses 1 byte, but set_basic uses 5-6 bits per symbol.
             * If basic encoding isn't possible, always choose RLE.
             */
            DEBUGLOG(5, "Selected set_basic");
            return set_basic;
        }
        DEBUGLOG(5, "Selected set_rle");
        return set_rle;
    }
    if (strategy < ZSTD_lazy) {
        if (isDefaultAllowed) {
            size_t const staticFse_nbSeq_max = 1000;
            size_t const mult = 10 - strategy;
            size_t const baseLog = 3;
            size_t const dynamicFse_nbSeq_min = (((size_t)1 << defaultNormLog) * mult) >> baseLog;  /* 28-36 for offset, 56-72 for lengths */
            assert(defaultNormLog >= 5 && defaultNormLog <= 6);  /* xx_DEFAULTNORMLOG */
            assert(mult <= 9 && mult >= 7);
            if ( (*repeatMode == FSE_repeat_valid)
              && (nbSeq < staticFse_nbSeq_max) ) {
                DEBUGLOG(5, "Selected set_repeat");
                return set_repeat;
            }
            if ( (nbSeq < dynamicFse_nbSeq_min)
              || (mostFrequent < (nbSeq >> (defaultNormLog-1))) ) {
                DEBUGLOG(5, "Selected set_basic");
                /* The format allows default tables to be repeated, but it isn't useful.
                 * When using simple heuristics to select encoding type, we don't want
                 * to confuse these tables with dictionaries. When running more careful
                 * analysis, we don't need to waste time checking both repeating tables
                 * and default tables.
                 */
                *repeatMode = FSE_repeat_none;
                return set_basic;
            }
        }
    } else {
        size_t const basicCost = isDefaultAllowed ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, count, max) : ERROR(GENERIC);
        size_t const repeatCost = *repeatMode != FSE_repeat_none ? ZSTD_fseBitCost(prevCTable, count, max) : ERROR(GENERIC);
        size_t const NCountCost = ZSTD_NCountCost(count, max, nbSeq, FSELog);
        size_t const compressedCost = (NCountCost << 3) + ZSTD_entropyCost(count, max, nbSeq);

        if (isDefaultAllowed) {
            assert(!ZSTD_isError(basicCost));
            assert(!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost)));
        }
        assert(!ZSTD_isError(NCountCost));
        assert(compressedCost < ERROR(maxCode));
        DEBUGLOG(5, "Estimated bit costs: basic=%u\trepeat=%u\tcompressed=%u",
                    (unsigned)basicCost, (unsigned)repeatCost, (unsigned)compressedCost);
        if (basicCost <= repeatCost && basicCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_basic");
            assert(isDefaultAllowed);
            *repeatMode = FSE_repeat_none;
            return set_basic;
        }
        if (repeatCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_repeat");
            assert(!ZSTD_isError(repeatCost));
            return set_repeat;
        }
        assert(compressedCost < basicCost && compressedCost < repeatCost);
    }
    DEBUGLOG(5, "Selected set_compressed");
    *repeatMode = FSE_repeat_check;
    return set_compressed;
}